

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O2

ColumnDefinition *
duckdb::ColumnDefinition::Deserialize
          (ColumnDefinition *__return_storage_ptr__,Deserializer *deserializer)

{
  TableColumnType category;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_138;
  undefined1 local_130 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  undefined1 local_108 [32];
  LogicalType local_e8;
  LogicalType type;
  LogicalType local_b8;
  undefined1 local_a0 [40];
  size_t local_78;
  reference_wrapper<duckdb::DatabaseInstance> rStack_70;
  Value local_68;
  
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>(&name,deserializer,100,"name");
  Deserializer::ReadProperty<duckdb::LogicalType>(&type,deserializer,0x65,"type");
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            ((Deserializer *)local_130,(field_id_t)deserializer,(char *)0x66);
  category = Deserializer::ReadProperty<duckdb::TableColumnType>(deserializer,0x67,"category");
  local_108._0_8_ = local_108 + 0x10;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name._M_dataplus._M_p == &name.field_2) {
    local_108._24_8_ = name.field_2._8_8_;
  }
  else {
    local_108._0_8_ = name._M_dataplus._M_p;
  }
  local_108._8_8_ = name._M_string_length;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  name._M_dataplus._M_p = (pointer)&name.field_2;
  LogicalType::LogicalType(&local_b8,&type);
  local_138._M_head_impl = (ParsedExpression *)local_130;
  local_130 = (undefined1  [8])0x0;
  ColumnDefinition(__return_storage_ptr__,(string *)local_108,&local_b8,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&local_138,category);
  if (local_138._M_head_impl != (ParsedExpression *)0x0) {
    (*((local_138._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_138._M_head_impl = (ParsedExpression *)0x0;
  LogicalType::~LogicalType(&local_b8);
  ::std::__cxx11::string::~string((string *)local_108);
  Deserializer::ReadProperty<duckdb::CompressionType>
            (deserializer,0x68,"compression_type",&__return_storage_ptr__->compression_type);
  LogicalType::LogicalType(&local_e8,SQLNULL);
  Value::Value(&local_68,&local_e8);
  Deserializer::ReadPropertyWithExplicitDefault<duckdb::Value>
            (deserializer,0x69,"comment",&__return_storage_ptr__->comment,&local_68);
  Value::~Value(&local_68);
  LogicalType::~LogicalType(&local_e8);
  local_a0._0_8_ = &rStack_70;
  local_a0._8_8_ = (_Elt_pointer)0x1;
  local_a0._16_8_ = (_Elt_pointer)0x0;
  local_a0._24_8_ = (_Map_pointer)0x0;
  local_a0._32_8_ = (_Map_pointer)0x3f800000;
  local_78 = 0;
  rStack_70._M_data = (DatabaseInstance *)0x0;
  Deserializer::
  ReadPropertyWithExplicitDefault<std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
            (deserializer,0x6a,"tags",&__return_storage_ptr__->tags,
             (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_a0);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_a0);
  if (local_130 != (undefined1  [8])0x0) {
    (**(code **)(*(_func_int **)local_130 + 8))();
  }
  LogicalType::~LogicalType(&type);
  ::std::__cxx11::string::~string((string *)&name);
  return __return_storage_ptr__;
}

Assistant:

ColumnDefinition ColumnDefinition::Deserialize(Deserializer &deserializer) {
	auto name = deserializer.ReadPropertyWithDefault<string>(100, "name");
	auto type = deserializer.ReadProperty<LogicalType>(101, "type");
	auto expression = deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(102, "expression");
	auto category = deserializer.ReadProperty<TableColumnType>(103, "category");
	ColumnDefinition result(std::move(name), std::move(type), std::move(expression), category);
	deserializer.ReadProperty<duckdb::CompressionType>(104, "compression_type", result.compression_type);
	deserializer.ReadPropertyWithExplicitDefault<Value>(105, "comment", result.comment, Value());
	deserializer.ReadPropertyWithExplicitDefault<unordered_map<string, string>>(106, "tags", result.tags, unordered_map<string, string>());
	return result;
}